

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xpath_query::evaluate_boolean(xpath_query *this,xpath_node *n)

{
  bool bVar1;
  undefined8 *puVar2;
  xpath_context c;
  xpath_stack_data sd;
  xpath_context local_2098;
  xpath_stack_data local_2070;
  
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    bVar1 = false;
  }
  else {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_2070.stack.result = &local_2070.result;
    local_2070.result._error = &local_2070.oom;
    local_2070.result._root = local_2070.blocks;
    local_2070.result._root_size = 0;
    local_2070.stack.temp = &local_2070.temp;
    local_2070.temp._root = local_2070.blocks + 1;
    local_2070.temp._root_size = 0;
    local_2070.oom = false;
    local_2070.blocks[1].next = (xpath_memory_block *)0x0;
    local_2070.blocks[0].next = (xpath_memory_block *)0x0;
    local_2070.blocks[1].capacity = 0x1000;
    local_2070.blocks[0].capacity = 0x1000;
    local_2070.temp._error = local_2070.result._error;
    bVar1 = impl::anon_unknown_0::xpath_ast_node::eval_boolean
                      (*this->_impl,&local_2098,&local_2070.stack);
    if (local_2070.oom == true) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = fclose;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&local_2070);
  }
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xpath_query::evaluate_boolean(const xpath_node& n) const
	{
		if (!_impl) return false;

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		bool r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_boolean(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return false;
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}